

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

uint64_t __thiscall kj::anon_unknown_36::WebSocketImpl::Header::getPayloadLen(Header *this)

{
  byte bVar1;
  byte payloadLen;
  Header *this_local;
  
  bVar1 = this->bytes[1] & 0x7f;
  if (bVar1 == 0x7f) {
    this_local = (Header *)
                 ((ulong)this->bytes[2] << 0x38 | (ulong)this->bytes[3] << 0x30 |
                  (ulong)this->bytes[4] << 0x28 | (ulong)this->bytes[5] << 0x20 |
                  (ulong)this->bytes[6] << 0x18 | (ulong)this->bytes[7] << 0x10 |
                  (ulong)this->bytes[8] << 8 | (ulong)this->bytes[9]);
  }
  else if (bVar1 == 0x7e) {
    this_local = (Header *)(ulong)CONCAT11(this->bytes[2],this->bytes[3]);
  }
  else {
    this_local = (Header *)(ulong)bVar1;
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t getPayloadLen() const {
      byte payloadLen = bytes[1] & PAYLOAD_LEN_MASK;
      if (payloadLen == 127) {
        return (static_cast<uint64_t>(bytes[2]) << 56)
             | (static_cast<uint64_t>(bytes[3]) << 48)
             | (static_cast<uint64_t>(bytes[4]) << 40)
             | (static_cast<uint64_t>(bytes[5]) << 32)
             | (static_cast<uint64_t>(bytes[6]) << 24)
             | (static_cast<uint64_t>(bytes[7]) << 16)
             | (static_cast<uint64_t>(bytes[8]) <<  8)
             | (static_cast<uint64_t>(bytes[9])      );
      } else if (payloadLen == 126) {
        return (static_cast<uint64_t>(bytes[2]) <<  8)
             | (static_cast<uint64_t>(bytes[3])      );
      } else {
        return payloadLen;
      }
    }